

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

xmlChar * xmlStrncatNew(xmlChar *str1,xmlChar *str2,int len)

{
  size_t sVar1;
  xmlChar *pxVar2;
  ulong __n;
  long lVar3;
  uint uVar4;
  ulong __n_00;
  
  if (len < 0) {
    if ((str2 != (xmlChar *)0x0) && (sVar1 = strlen((char *)str2), sVar1 < 0x80000000)) {
      len = (int)sVar1;
      goto LAB_001ceba8;
    }
  }
  else {
LAB_001ceba8:
    if (str2 != (xmlChar *)0x0 && len != 0) {
      if (str1 != (xmlChar *)0x0) {
        sVar1 = strlen((char *)str1);
        uVar4 = (uint)sVar1;
        if (0x7fffffff < sVar1) {
          uVar4 = 0;
        }
        if ((int)uVar4 < 0) {
          return (xmlChar *)0x0;
        }
        if ((int)(len ^ 0x7fffffffU) < (int)uVar4) {
          return (xmlChar *)0x0;
        }
        __n = (ulong)uVar4;
        __n_00 = (ulong)(uint)len;
        pxVar2 = (xmlChar *)(*xmlMalloc)(__n_00 + __n + 1);
        if (pxVar2 != (xmlChar *)0x0) {
          memcpy(pxVar2,str1,__n);
          memcpy(pxVar2 + __n,str2,__n_00);
          pxVar2[__n_00 + __n] = '\0';
          return pxVar2;
        }
        xmlErrMemory((xmlParserCtxtPtr)0x0,(char *)0x0);
        str2 = str1;
        len = uVar4;
      }
      goto LAB_001cec9b;
    }
  }
  if (str1 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  lVar3 = 0;
  do {
    pxVar2 = str1 + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pxVar2 != '\0');
  len = (int)lVar3 - 1;
  str2 = str1;
LAB_001cec9b:
  pxVar2 = xmlStrndup(str2,len);
  return pxVar2;
}

Assistant:

xmlChar *
xmlStrncatNew(const xmlChar *str1, const xmlChar *str2, int len) {
    int size;
    xmlChar *ret;

    if (len < 0) {
        len = xmlStrlen(str2);
        if (len < 0)
            return(NULL);
    }
    if ((str2 == NULL) || (len == 0))
        return(xmlStrdup(str1));
    if (str1 == NULL)
        return(xmlStrndup(str2, len));

    size = xmlStrlen(str1);
    if ((size < 0) || (size > INT_MAX - len))
        return(NULL);
    ret = (xmlChar *) xmlMalloc((size_t) size + len + 1);
    if (ret == NULL) {
        xmlErrMemory(NULL, NULL);
        return(xmlStrndup(str1, size));
    }
    memcpy(ret, str1, size);
    memcpy(&ret[size], str2, len);
    ret[size + len] = 0;
    return(ret);
}